

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  string *__rhs;
  short sVar1;
  cmState *pcVar2;
  cmCursesCacheEntryComposite **ppcVar3;
  char cVar4;
  _Bool _Var5;
  bool bVar6;
  int iVar7;
  FIELD *pFVar8;
  long *plVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  char *__s;
  cmCursesLongMessageForm *pcVar14;
  long lVar15;
  long *plVar16;
  uint uVar17;
  FIELD **ppFVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *messages;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  _Var22;
  FORM *pFVar23;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  __it;
  FIELD *local_138;
  int key;
  allocator<char> local_12a;
  allocator<char> local_129;
  string searchstr;
  string local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  string *local_c0;
  char debugMessage [128];
  
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
switchD_0013a367_caseD_71:
    return;
  }
  __rhs = &this->SearchString;
  local_c0 = (string *)&this->OldSearchString;
  local_c8 = &this->Errors;
  local_d0 = &this->HelpMessage;
  uVar20 = 0;
LAB_0013a121:
  while( true ) {
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    if (this->SearchMode == true) {
      std::operator+(&searchstr,"Search: ",__rhs);
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,searchstr._M_dataplus._M_p);
      PrintKeys(this,1);
      move((int)uVar20 + -5);
      uVar20 = 0xffffffffffffffff;
      if (_stdscr != 0) {
        uVar20 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      }
      wtouchln(_stdscr,0,uVar20,1);
      refresh();
      std::__cxx11::string::~string((string *)&searchstr);
    }
    key = wgetch(_stdscr);
    uVar20 = 0xffffffffffffffff;
    if (_stdscr != 0) break;
LAB_0013a1ea:
    if (key == 0x71) {
      return;
    }
  }
  sVar1 = *(short *)(_stdscr + 6);
  uVar20 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
  if (*(short *)(_stdscr + 4) < 5 || sVar1 < 0x40) goto LAB_0013a1ea;
  pFVar8 = current_field((this->super_cmCursesForm).Form);
  plVar9 = (long *)field_userptr(pFVar8);
  if (this->SearchMode != true) {
    if ((plVar9 == (long *)0x0) ||
       (cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9,&key,this,_stdscr), cVar4 == '\0'))
    goto LAB_0013a316;
    this->OkToGenerate = false;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    goto switchD_0013a367_caseD_65;
  }
  if ((key == 0x157) || (key == 10)) {
    this->SearchMode = false;
    if ((this->SearchString)._M_string_length != 0) {
      JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
      std::__cxx11::string::_M_assign(local_c0);
    }
    std::__cxx11::string::assign((char *)__rhs);
  }
  else if (((key & 0xffffffdfU) - 0x41 < 0x1a) || (key == 0x5f || key - 0x30U < 10)) {
    if ((this->SearchString)._M_string_length < (ulong)(ushort)(sVar1 - 9)) {
      std::__cxx11::string::push_back((char)__rhs);
    }
  }
  else if ((((key == 8) || (key == 0x14a)) || (key == 0x107)) &&
          ((this->SearchString)._M_string_length != 0)) {
    std::__cxx11::string::resize((ulong)__rhs);
  }
LAB_0013a316:
  if (this->SearchMode != false) goto switchD_0013a367_caseD_65;
  sprintf(debugMessage,"Main form handling input, key: %d",(ulong)(uint)key);
  cmCursesForm::LogMessage(debugMessage);
  switch(key) {
  case 99:
    Configure(this,0);
    break;
  case 100:
    if (this->NumberOfVisibleEntries != 0) {
      this->OkToGenerate = false;
      pFVar8 = current_field((this->super_cmCursesForm).Form);
      iVar7 = field_index(pFVar8);
      lVar15 = (long)iVar7;
      if (iVar7 == 2) {
        ppFVar18 = this->Fields;
        local_138 = (FIELD *)0x0;
      }
      else {
        ppFVar18 = this->Fields;
        if (this->NumberOfVisibleEntries * 3 + -1 == lVar15) {
          local_138 = ppFVar18[lVar15 + -5];
        }
        else {
          local_138 = ppFVar18[lVar15 + 1];
        }
      }
      plVar9 = (long *)field_userptr(ppFVar18[lVar15 + -2]);
      if (plVar9 != (long *)0x0) {
        pcVar2 = this->CMakeInstance->State;
        pcVar10 = (char *)(**(code **)(*plVar9 + 0x28))(plVar9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&searchstr,pcVar10,(allocator<char> *)&local_f0);
        cmState::RemoveCacheEntry(pcVar2,&searchstr);
        std::__cxx11::string::~string((string *)&searchstr);
        searchstr._M_dataplus._M_p = (pointer)&searchstr.field_2;
        searchstr._M_string_length = 0;
        searchstr.field_2._M_local_buf[0] = '\0';
        if (local_138 != (FIELD *)0x0) {
          plVar16 = (long *)field_userptr(local_138);
          (**(code **)(*plVar16 + 0x28))(plVar16);
          std::__cxx11::string::assign((char *)&searchstr);
        }
        uVar21 = 0xffffffffffffffff;
        uVar20 = 0xffffffff;
        if (_stdscr != 0) {
          uVar20 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
          uVar21 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
        }
        pcVar10 = (char *)(**(code **)(*plVar9 + 0x28))(plVar9);
        RemoveEntry(this,pcVar10);
        RePost(this);
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar21 & 0xffffffff,uVar20);
        if (local_138 != (FIELD *)0x0) {
          __it._M_current =
               (this->Entries->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
          ppcVar3 = (this->Entries->
                    super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          local_f0._M_dataplus._M_p = (pointer)&searchstr;
          lVar19 = (long)ppcVar3 - (long)__it._M_current;
          for (lVar15 = lVar19 >> 5; _Var22._M_current = __it._M_current, 0 < lVar15;
              lVar15 = lVar15 + -1) {
            bVar6 = __gnu_cxx::__ops::_Iter_pred<cmCursesMainForm::HandleInput()::$_0>::operator()
                              ((_Iter_pred<cmCursesMainForm::HandleInput()::__0> *)&local_f0,__it);
            if (bVar6) goto LAB_0013aa3e;
            bVar6 = __gnu_cxx::__ops::_Iter_pred<cmCursesMainForm::HandleInput()::$_0>::operator()
                              ((_Iter_pred<cmCursesMainForm::HandleInput()::__0> *)&local_f0,
                               (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                )(__it._M_current + 1));
            _Var22._M_current = __it._M_current + 1;
            if (bVar6) goto LAB_0013aa3e;
            bVar6 = __gnu_cxx::__ops::_Iter_pred<cmCursesMainForm::HandleInput()::$_0>::operator()
                              ((_Iter_pred<cmCursesMainForm::HandleInput()::__0> *)&local_f0,
                               (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                )(__it._M_current + 2));
            _Var22._M_current = __it._M_current + 2;
            if (bVar6) goto LAB_0013aa3e;
            bVar6 = __gnu_cxx::__ops::_Iter_pred<cmCursesMainForm::HandleInput()::$_0>::operator()
                              ((_Iter_pred<cmCursesMainForm::HandleInput()::__0> *)&local_f0,
                               (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                )(__it._M_current + 3));
            _Var22._M_current = __it._M_current + 3;
            if (bVar6) goto LAB_0013aa3e;
            __it._M_current = __it._M_current + 4;
            lVar19 = lVar19 + -0x20;
          }
          lVar19 = lVar19 >> 3;
          if (lVar19 == 1) {
LAB_0013aa28:
            bVar6 = __gnu_cxx::__ops::_Iter_pred<cmCursesMainForm::HandleInput()::$_0>::operator()
                              ((_Iter_pred<cmCursesMainForm::HandleInput()::__0> *)&local_f0,__it);
            _Var22._M_current = ppcVar3;
            if (bVar6) {
              _Var22._M_current = __it._M_current;
            }
          }
          else if (lVar19 == 2) {
LAB_0013aa07:
            bVar6 = __gnu_cxx::__ops::_Iter_pred<cmCursesMainForm::HandleInput()::$_0>::operator()
                              ((_Iter_pred<cmCursesMainForm::HandleInput()::__0> *)&local_f0,_Var22)
            ;
            if (!bVar6) {
              __it._M_current = _Var22._M_current + 1;
              goto LAB_0013aa28;
            }
          }
          else {
            _Var22._M_current = ppcVar3;
            if ((lVar19 == 3) &&
               (bVar6 = __gnu_cxx::__ops::_Iter_pred<cmCursesMainForm::HandleInput()::$_0>::
                        operator()((_Iter_pred<cmCursesMainForm::HandleInput()::__0> *)&local_f0,
                                   __it), _Var22._M_current = __it._M_current, !bVar6)) {
              _Var22._M_current = __it._M_current + 1;
              goto LAB_0013aa07;
            }
          }
LAB_0013aa3e:
          if (_Var22._M_current !=
              (this->Entries->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            set_current_field((this->super_cmCursesForm).Form,(*_Var22._M_current)->Entry->Field);
          }
        }
        std::__cxx11::string::~string((string *)&searchstr);
      }
    }
    break;
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
    break;
  case 0x67:
    if (this->OkToGenerate == true) {
      Generate(this);
      return;
    }
    break;
  case 0x68:
    uVar17 = 0xffffffff;
    uVar20 = 0xffffffff;
    if (_stdscr != 0) {
      uVar20 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      uVar17 = (int)*(short *)(_stdscr + 6) + 1;
    }
    pFVar8 = current_field((this->super_cmCursesForm).Form);
    iVar7 = field_index(pFVar8);
    plVar9 = (long *)field_userptr(this->Fields[(long)iVar7 + -2]);
    pcVar10 = (char *)(**(code **)(*plVar9 + 0x28))(plVar9);
    pcVar2 = this->CMakeInstance->State;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&searchstr,pcVar10,(allocator<char> *)&local_f0);
    pcVar11 = cmState::GetCacheEntryValue(pcVar2,&searchstr);
    std::__cxx11::string::~string((string *)&searchstr);
    if (pcVar11 == (char *)0x0) {
LAB_0013a763:
      messages = local_d0;
      std::__cxx11::string::assign
                ((char *)((local_d0->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    else {
      pcVar2 = this->CMakeInstance->State;
      std::__cxx11::string::string<std::allocator<char>>((string *)&searchstr,pcVar10,&local_129);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"HELPSTRING",&local_12a);
      pcVar11 = cmState::GetCacheEntryProperty(pcVar2,&searchstr,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&searchstr);
      if (pcVar11 == (char *)0x0) goto LAB_0013a763;
      sVar12 = strlen(pcVar10);
      sVar13 = strlen(pcVar11);
      __s = (char *)operator_new__(sVar12 + sVar13 + 0x40);
      sprintf(__s,"Current option is: %s\nHelp string for this option is: %s\n",pcVar10,pcVar11);
      messages = local_d0;
      std::__cxx11::string::assign
                ((char *)((local_d0->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1));
      operator_delete__(__s);
    }
    pcVar14 = (cmCursesLongMessageForm *)operator_new(0x60);
    cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar14,messages,"Help.");
    cmCursesForm::CurrentForm = (cmCursesForm *)pcVar14;
    (*(pcVar14->super_cmCursesForm)._vptr_cmCursesForm[3])(pcVar14,1,1,(ulong)uVar17,uVar20);
    (*(pcVar14->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar14);
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar17,uVar20);
    pFVar23 = (this->super_cmCursesForm).Form;
    goto LAB_0013a7eb;
  case 0x6a:
switchD_0013a367_caseD_6a:
    pFVar8 = current_field((this->super_cmCursesForm).Form);
    iVar7 = field_index(pFVar8);
    if (this->NumberOfVisibleEntries * 3 + -1 == (long)iVar7) goto LAB_0013a121;
    _Var5 = new_page(this->Fields[(long)iVar7 + 1]);
    pFVar23 = (this->super_cmCursesForm).Form;
    if (_Var5) {
LAB_0013a433:
      iVar7 = 0x200;
    }
    else {
      iVar7 = 0x204;
    }
LAB_0013a759:
    form_driver(pFVar23,iVar7);
    break;
  case 0x6b:
switchD_0013a367_caseD_6b:
    pFVar8 = current_field((this->super_cmCursesForm).Form);
    iVar7 = field_index(pFVar8);
    if (iVar7 == 2) goto LAB_0013a121;
    _Var5 = new_page(this->Fields[(long)iVar7 + -2]);
    pFVar23 = (this->super_cmCursesForm).Form;
    if (!_Var5) {
      iVar7 = 0x205;
      goto LAB_0013a759;
    }
    form_driver(pFVar23,0x201);
    pFVar23 = (this->super_cmCursesForm).Form;
    pFVar8 = this->Fields[(long)iVar7 + -3];
LAB_0013a7eb:
    set_current_field(pFVar23,pFVar8);
    break;
  case 0x6c:
    uVar21 = 0xffffffffffffffff;
    uVar20 = 0xffffffff;
    if (_stdscr != 0) {
      uVar20 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      uVar21 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
    }
    pcVar14 = (cmCursesLongMessageForm *)operator_new(0x60);
    cmCursesLongMessageForm::cmCursesLongMessageForm
              (pcVar14,local_c8,"Errors occurred during the last pass.");
    cmCursesForm::CurrentForm = (cmCursesForm *)pcVar14;
    (*(pcVar14->super_cmCursesForm)._vptr_cmCursesForm[3])(pcVar14,1,1,uVar21 & 0xffffffff,uVar20);
    (*(pcVar14->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar14);
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    goto LAB_0013a6f4;
  case 0x6e:
    if ((this->OldSearchString)._M_string_length != 0) {
      JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
    }
    break;
  case 0x71:
    goto switchD_0013a367_caseD_71;
  case 0x74:
    this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
    uVar21 = 0xffffffffffffffff;
    uVar20 = 0xffffffff;
    if (_stdscr != 0) {
      uVar20 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      uVar21 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
    }
    RePost(this);
LAB_0013a6f4:
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar21 & 0xffffffff,uVar20);
    break;
  default:
    if (key == 4) {
LAB_0013a42f:
      pFVar23 = (this->super_cmCursesForm).Form;
      goto LAB_0013a433;
    }
    if (key == 0xe) goto switchD_0013a367_caseD_6a;
    if (key == 0x10) goto switchD_0013a367_caseD_6b;
    if (key == 0x15) {
LAB_0013a421:
      pFVar23 = (this->super_cmCursesForm).Form;
      iVar7 = 0x201;
      goto LAB_0013a759;
    }
    if (key == 0x2f) {
      this->SearchMode = true;
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
      PrintKeys(this,1);
      uVar21 = 0xffffffffffffffff;
      if (_stdscr != 0) {
        uVar21 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      }
      wtouchln(_stdscr,0,uVar21,1);
      refresh();
    }
    else {
      if (key == 0x153) goto LAB_0013a421;
      if (key == 0x103) goto switchD_0013a367_caseD_6b;
      if (key == 0x152) goto LAB_0013a42f;
      if (key == 0x102) goto switchD_0013a367_caseD_6a;
    }
  }
switchD_0013a367_caseD_65:
  uVar21 = 0xffffffffffffffff;
  if (_stdscr != 0) {
    uVar21 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
  }
  wtouchln(_stdscr,0,uVar21,1);
  wrefresh(_stdscr);
  goto LAB_0013a121;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x = 0, y = 0;

  if (!this->Form) {
    return;
  }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for (;;) {
    this->UpdateStatusBar();
    this->PrintKeys();
    if (this->SearchMode) {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar(searchstr.c_str());
      this->PrintKeys(1);
      curses_move(y - 5, static_cast<unsigned int>(searchstr.size()));
      // curses_move(1,1);
      touchwin(stdscr);
      refresh();
    }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        break;
      }
      continue;
    }

    currentField = current_field(this->Form);
    currentWidget =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));

    bool widgetHandled = false;

    if (this->SearchMode) {
      if (key == 10 || key == KEY_ENTER) {
        this->SearchMode = false;
        if (!this->SearchString.empty()) {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
        }
        this->SearchString = "";
      }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') || (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') || (key == '_')) {
        if (this->SearchString.size() <
            static_cast<std::string::size_type>(x - 10)) {
          this->SearchString += static_cast<char>(key);
        }
      } else if (key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC) {
        if (!this->SearchString.empty()) {
          this->SearchString.resize(this->SearchString.size() - 1);
        }
      }
    } else if (currentWidget && !this->SearchMode) {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled) {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
      }
    }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode) {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if (key == 'q') {
        break;
      }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow down, ctrl+n (emacs binding), or j (vim
      // binding)
      if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          continue;
        }
        if (new_page(this->Fields[findex + 1])) {
          form_driver(this->Form, REQ_NEXT_PAGE);
        } else {
          form_driver(this->Form, REQ_NEXT_FIELD);
        }
      }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow up, ctrl+p (emacs binding), or k (vim binding)
      else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if (findex == 2) {
          continue;
        }
        if (new_page(this->Fields[findex - 2])) {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex - 3]);
        } else {
          form_driver(this->Form, REQ_PREV_FIELD);
        }
      }
      // pg down
      else if (key == KEY_NPAGE || key == ctrl('d')) {
        form_driver(this->Form, REQ_NEXT_PAGE);
      }
      // pg up
      else if (key == KEY_PPAGE || key == ctrl('u')) {
        form_driver(this->Form, REQ_PREV_PAGE);
      }
      // configure
      else if (key == 'c') {
        this->Configure();
      }
      // display help
      else if (key == 'h') {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        const char* curField = lbl->GetValue();
        const char* helpString = nullptr;

        const char* existingValue =
          this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
        if (existingValue) {
          helpString = this->CMakeInstance->GetState()->GetCacheEntryProperty(
            curField, "HELPSTRING");
        }
        if (helpString) {
          char* message = new char
            [strlen(curField) + strlen(helpString) +
             strlen(
               "Current option is: \n Help string for this option is: \n") +
             10];
          sprintf(
            message,
            "Current option is: %s\nHelp string for this option is: %s\n",
            curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
        } else {
          this->HelpMessage[1] = "";
        }

        cmCursesLongMessageForm* msgs =
          new cmCursesLongMessageForm(this->HelpMessage, "Help.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
        set_current_field(this->Form, cur);
      }
      // display last errors
      else if (key == 'l') {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->Errors, "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
      } else if (key == '/') {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
      } else if (key == 'n') {
        if (!this->OldSearchString.empty()) {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
        }
      }
      // switch advanced on/off
      else if (key == 't') {
        if (this->AdvancedMode) {
          this->AdvancedMode = false;
        } else {
          this->AdvancedMode = true;
        }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
      }
      // generate and exit
      else if (key == 'g') {
        if (this->OkToGenerate) {
          this->Generate();
          break;
        }
      }
      // delete cache entry
      else if (key == 'd' && this->NumberOfVisibleEntries) {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if (findex == 2) {
          nextCur = nullptr;
        } else if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          nextCur = this->Fields[findex - 5];
        } else {
          nextCur = this->Fields[findex + 1];
        }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        if (lbl) {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur) {
            nextVal =
              (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))
                 ->GetValue());
          }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur) {
            // make the next or prev. current field after deletion
            auto nextEntryIt =
              std::find_if(this->Entries->begin(), this->Entries->end(),
                           [&nextVal](cmCursesCacheEntryComposite* entry) {
                             return nextVal == entry->Key;
                           });

            if (nextEntryIt != this->Entries->end()) {
              set_current_field(this->Form, (*nextEntryIt)->Entry->Field);
            }
          }
        }
      }
    }

    touchwin(stdscr);
    wrefresh(stdscr);
  }
}